

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argize.c
# Opt level: O0

int countargs(char *cmdline)

{
  ushort **ppuVar1;
  byte *in_RDI;
  int argc;
  int state;
  char *p;
  int local_18;
  undefined4 local_14;
  byte *local_10;
  
  local_14 = 0;
  local_18 = 0;
  local_10 = in_RDI;
  do {
    if (*local_10 == 0) {
      return local_18;
    }
    switch(local_14) {
    case 0:
      while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)*local_10] & 0x2000) != 0) {
        local_10 = local_10 + 1;
      }
      if (*local_10 == 0) break;
    case 1:
      local_18 = local_18 + 1;
      local_14 = 2;
switchD_00246d67_caseD_2:
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)(uint)*local_10] & 0x2000) == 0) {
        if (*local_10 == 0x22) {
          local_14 = 3;
        }
        else if (*local_10 == 0x5c) {
          local_14 = 4;
        }
      }
      else {
        local_14 = 0;
      }
      local_10 = local_10 + 1;
      break;
    case 2:
      goto switchD_00246d67_caseD_2;
    case 3:
      if (*local_10 == 0x22) {
        local_14 = 2;
      }
      else if (*local_10 == 0x5c) {
        local_14 = 5;
      }
      local_10 = local_10 + 1;
      break;
    case 4:
      local_10 = local_10 + 1;
      local_14 = 2;
      break;
    case 5:
      local_10 = local_10 + 1;
      local_14 = 3;
    }
  } while( true );
}

Assistant:

int countargs(const char *cmdline)
{
    const char *p = cmdline;
    int                     state = 0;
    int                     argc = 0;

    while (*p) {
        switch (state) {
        case 0:                                 /* skip leading white space */
            while (isspace((unsigned char)*p)) p++;
            if (!*p) break;            /* If there's nothing left, get out. */
            state = 1;
            /* fall through */;

        case 1:                                                /* begin arg */
            argc++;
            state = 2;
            /* fall through */

        case 2:                            /* collect chars for current arg */
            if (isspace((unsigned char)*p))
                p++, state = 0;                       /* Terminate this arg */
            else if (*p == '"')
                p++, state = 3;                              /* Open quote. */
            else if (*p == '\\')
                p++, state = 4;                         /* Escape sequence. */
            else
                p++;                                    /* Just keep going. */

            break;

        case 3:                             /* collect chars inside quotes. */
            switch (*p) {
            case '"' : p++; state = 2; break;                /* Close quote */
            case '\\': p++; state = 5; break;           /* Escape sequence. */
            default:   p++; break;
            }
            break;

        case 4:                        /* escaped character outside quotes. */
            p++; state = 2;
            break;

        case 5:                         /* escaped character inside quotes. */
            p++; state = 3;
            break;
        }
    }

    return argc;
}